

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_InvalidObjIndex_Test::TestBody(ProblemTest_InvalidObjIndex_Test *this)

{
  bool bVar1;
  MutObjective MVar2;
  AssertionFailure *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  int i;
  int num_objs;
  Problem p;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffafc;
  int in_stack_fffffffffffffb00;
  Type in_stack_fffffffffffffb04;
  undefined4 in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  Type in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb20;
  int in_stack_fffffffffffffb24;
  char *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  Message *in_stack_fffffffffffffb68;
  AssertHelper *in_stack_fffffffffffffb70;
  allocator<char> local_421;
  string local_420 [32];
  AssertionResult local_400 [3];
  int local_3cc;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3c8;
  int local_3c0;
  byte local_3b2;
  allocator<char> local_3b1;
  string local_3b0 [32];
  AssertionResult local_390;
  LinearExpr *local_380;
  int local_368;
  undefined4 local_364;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(in_stack_fffffffffffffb10);
  local_364 = 3;
  for (local_368 = 0; local_368 < 3; local_368 = local_368 + 1) {
    local_380 = (LinearExpr *)
                mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
                          ((BasicProblem<mp::BasicProblemParams<int>_> *)
                           CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                           in_stack_fffffffffffffb04,in_stack_fffffffffffffb00);
  }
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_390);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    std::allocator<char>::~allocator(&local_3b1);
    local_3b2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         in_stack_fffffffffffffafc);
      local_3c8 = MVar2.
                  super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
      local_3c0 = MVar2.
                  super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
    }
    if ((local_3b2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 (char (*) [95])CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      local_3cc = 5;
    }
    else {
      local_3cc = 0;
    }
    std::__cxx11::string::~string(local_3b0);
    if (local_3cc != 0) goto LAB_0011b14a;
  }
  else {
LAB_0011b14a:
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    testing::AssertionResult::failure_message((AssertionResult *)0x11b166);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb1c,(char *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c
               ,(char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
    testing::Message::~Message((Message *)0x11b1c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b21b);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_400);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    std::allocator<char>::~allocator(&local_421);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)
                         CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                         in_stack_fffffffffffffafc);
      in_stack_fffffffffffffb24 =
           MVar2.
           super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               (char (*) [101])CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    local_3cc = 6;
    std::__cxx11::string::~string(local_420);
    if (local_3cc == 0) goto LAB_0011b645;
  }
  testing::Message::Message
            ((Message *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  in_stack_fffffffffffffaf0 =
       (BasicProblem<mp::BasicProblemParams<int>_> *)
       testing::AssertionResult::failure_message((AssertionResult *)0x11b5a0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
             in_stack_fffffffffffffb1c,(char *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
             (char *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffaf0);
  testing::Message::~Message((Message *)0x11b5fd);
LAB_0011b645:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b652);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(in_stack_fffffffffffffaf0);
  return;
}

Assistant:

TEST(ProblemTest, InvalidObjIndex) {
  Problem p;
  const int num_objs = 3;
  for (int i = 0; i < num_objs; ++i)
    p.AddObj(mp::obj::MIN);
  EXPECT_ASSERT(p.obj(-1), "invalid index");
  EXPECT_ASSERT(p.obj(num_objs), "invalid index");
}